

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

float ScaleMaxSamples_C(float *src,float *dst,float scale,int width)

{
  float fVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  
  if (width < 1) {
    fVar3 = 0.0;
  }
  else {
    lVar2 = 0;
    fVar4 = 0.0;
    do {
      fVar1 = src[lVar2];
      fVar3 = fVar1;
      if (fVar1 <= fVar4) {
        fVar3 = fVar4;
      }
      dst[lVar2] = fVar1 * scale;
      lVar2 = lVar2 + 1;
      fVar4 = fVar3;
    } while (width != (int)lVar2);
  }
  return fVar3;
}

Assistant:

float ScaleMaxSamples_C(const float* src, float* dst, float scale, int width) {
  float fmax = 0.f;
  int i;
  for (i = 0; i < width; ++i) {
    float v = *src++;
    float vs = v * scale;
    fmax = (v > fmax) ? v : fmax;
    *dst++ = vs;
  }
  return fmax;
}